

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilOpTestCase::SetStencilOp
          (StencilOpTestCase *this,GLenum stencilOpValue)

{
  GLenum GVar1;
  GLenum fail;
  
  GVar1 = this->m_stencilOpName;
  if (GVar1 == 0xb94) {
LAB_003a1b1e:
    GVar1 = 0x1e00;
    fail = stencilOpValue;
  }
  else {
    if (GVar1 != 0xb95) {
      if ((GVar1 == 0xb96) || (GVar1 == 0x8803)) {
        glu::CallLogWrapper::glStencilOp
                  (&(this->super_ApiCase).super_CallLogWrapper,0x1e00,0x1e00,stencilOpValue);
        return;
      }
      if (GVar1 != 0x8802) {
        if (GVar1 != 0x8801) {
          return;
        }
        goto LAB_003a1b1e;
      }
    }
    fail = 0x1e00;
    GVar1 = stencilOpValue;
  }
  glu::CallLogWrapper::glStencilOp(&(this->super_ApiCase).super_CallLogWrapper,fail,GVar1,0x1e00);
  return;
}

Assistant:

virtual void SetStencilOp (GLenum stencilOpValue)
	{
		switch (m_stencilOpName)
		{
		case GL_STENCIL_FAIL:
		case GL_STENCIL_BACK_FAIL:
			glStencilOp(stencilOpValue, GL_KEEP, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_FAIL:
		case GL_STENCIL_BACK_PASS_DEPTH_FAIL:
			glStencilOp(GL_KEEP, stencilOpValue, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_PASS:
		case GL_STENCIL_BACK_PASS_DEPTH_PASS:
			glStencilOp(GL_KEEP, GL_KEEP, stencilOpValue);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}